

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc7.c
# Opt level: O3

LispPTR N_OP_misc7(LispPTR arg1,LispPTR arg2,LispPTR arg3,LispPTR arg4,LispPTR arg5,LispPTR arg6,
                  LispPTR arg7,int alpha)

{
  DLword *pDVar1;
  ushort uVar2;
  LispPTR LVar3;
  byte bVar4;
  uint uVar5;
  ushort *puVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  pDVar1 = Lisp_world;
  if (alpha == 1) {
    if ((arg2 & 0xfff0000) == 0xf0000) {
      uVar11 = arg2 | 0xffff0000;
    }
    else if ((arg2 & 0xfff0000) == 0xe0000) {
      uVar11 = arg2 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg2 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0012df2f;
      if ((arg2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg2);
      }
      uVar11 = *(uint *)(Lisp_world + arg2);
    }
    if ((arg3 & 0xfff0000) == 0xf0000) {
      uVar10 = arg3 | 0xffff0000;
    }
    else if ((arg3 & 0xfff0000) == 0xe0000) {
      uVar10 = arg3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0012df2f;
      if ((arg3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg3);
      }
      uVar10 = *(uint *)(Lisp_world + arg3);
    }
    if ((arg4 & 0xfff0000) == 0xf0000) {
      uVar7 = arg4 | 0xffff0000;
    }
    else if ((arg4 & 0xfff0000) == 0xe0000) {
      uVar7 = arg4 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0012df2f;
      if ((arg4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg4);
      }
      uVar7 = *(uint *)(Lisp_world + arg4);
    }
    if ((arg5 & 0xfff0000) == 0xf0000) {
      uVar8 = arg5 | 0xffff0000;
    }
    else if ((arg5 & 0xfff0000) == 0xe0000) {
      uVar8 = arg5 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg5 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0012df2f;
      if ((arg5 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg5);
      }
      uVar8 = *(uint *)(Lisp_world + arg5);
    }
    if ((arg6 & 0xfff0000) == 0xf0000) {
      uVar12 = arg6 | 0xffff0000;
    }
    else if ((arg6 & 0xfff0000) == 0xe0000) {
      uVar12 = arg6 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0012df2f;
      if ((arg6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg6);
      }
      uVar12 = *(uint *)(Lisp_world + arg6);
    }
    pDVar1 = pDVar1 + arg1;
    uVar5 = uVar11 + 0xf;
    if (-1 < (int)uVar11) {
      uVar5 = uVar11;
    }
    bVar4 = (byte)uVar11 & 0xf;
    uVar11 = 0x8000 >> bVar4;
    puVar6 = (ushort *)((ulong)(pDVar1 + (int)(((int)uVar5 >> 4) + (uVar8 - uVar10) * uVar12)) ^ 2);
    uVar2 = *puVar6;
    ScreenLocked = 1;
    if (uVar7 != 2) {
      if (uVar7 == 1) {
        uVar9 = (ushort)(-0x8001 >> bVar4) & uVar2;
      }
      else {
        uVar9 = (ushort)uVar11;
        if (uVar7 == 0) {
          uVar9 = uVar2 ^ uVar9;
        }
        else {
          uVar9 = uVar2 | uVar9;
        }
      }
      *puVar6 = uVar9;
    }
    if ((DisplayRegion68k <= pDVar1) && (pDVar1 <= DISP_MAX_Address)) {
      flush_display_ptrregion
                (pDVar1 + (int)(((int)uVar5 >> 4) + (uVar8 - uVar10) * uVar12),0,0x10,1);
    }
    ScreenLocked = 0;
    LVar3 = 0xe0001 - ((uVar11 & uVar2) == 0);
  }
  else {
LAB_0012df2f:
    MachineState.errorexit = 1;
    LVar3 = 0xffffffff;
    MachineState.tosvalue = arg7;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_misc7(LispPTR arg1, LispPTR arg2, LispPTR arg3, LispPTR arg4, LispPTR arg5, LispPTR arg6, LispPTR arg7, int alpha)
{
  DLword *base;
  int x, y, operation, heightminus1, rasterwidth, oldbit;
  int offset;
  DLword bmdata;
  DLword bmmask;
#ifdef REALCURSOR
  int displayflg;
#endif

  DBPRINT(("MISC7 op with alpha byte %d.\n", alpha));

  if (alpha != 1) ERROR_EXIT(arg7);

  base = NativeAligned2FromLAddr(arg1);
  N_GETNUMBER(arg2, x, doufn);
  N_GETNUMBER(arg3, y, doufn);
  N_GETNUMBER(arg4, operation, doufn);
  N_GETNUMBER(arg5, heightminus1, doufn);
  N_GETNUMBER(arg6, rasterwidth, doufn);

  DBPRINT(("MISC7 args OK.\n"));

#ifdef REALCURSOR
  displayflg = n_new_cursorin(base, x, (heightminus1 - y), 1, 1);
  if (displayflg)
    HideCursor();
#endif

/* Bitmaps use a positive integer coordinate system with the lower left
   corner pixel at coordinate (0, 0). Storage is allocated in 16-bit words
   from the upper left corner (0, h-1), with rasterwidth 16-bit words per row.
*/
  offset = (rasterwidth * (heightminus1 - y)) + (x / BITSPER_DLWORD);
  bmmask = (1 << (BITSPER_DLWORD - 1)) >> (x & (BITSPER_DLWORD - 1));
  bmdata = GETWORDBASEWORD(base, offset);
  oldbit = bmdata & bmmask;

  ScreenLocked = T;

  switch (operation) {
  case OP_INVERT: GETWORDBASEWORD(base, offset) = bmdata ^ bmmask; break;
  case OP_ERASE: GETWORDBASEWORD(base, offset) = bmdata & ~bmmask; break;
  case OP_READ: break;
  default: GETWORDBASEWORD(base, offset) = bmdata | bmmask;
  }


#if defined(XWINDOW) || defined(SDL)
  if (in_display_segment(base)) {
    /* NB: base + offset doesn't need WORDPTR() wrapper */
    flush_display_ptrregion(base + offset, 0, 16, 1);
  }
#endif /* XWINDOW || SDL */

  ScreenLocked = NIL;
  DBPRINT(("FBITMAPBIT old bit = 0x%x.\n", oldbit));
  return (S_POSITIVE | (oldbit ? 1 : 0));

doufn:
  ERROR_EXIT(arg7);

}